

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O1

void __thiscall
Js::ScriptFunctionWithInlineCache::AllocateInlineCache(ScriptFunctionWithInlineCache *this)

{
  Type *addr;
  uint uVar1;
  Type TVar2;
  ThreadContext *this_00;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  PropertyId PVar6;
  undefined4 *puVar7;
  FunctionBody *this_01;
  FunctionBody *this_02;
  ScriptContext *pSVar8;
  Recycler *pRVar9;
  void **ppvVar10;
  uchar *puVar11;
  void *pvVar12;
  RootObjectBase *this_03;
  PropertyRecord *pPVar13;
  InlineCache *pIVar14;
  uint uVar15;
  uint uVar16;
  ulong size;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  Type *addr_00;
  undefined1 local_b0 [8];
  TrackAllocData data;
  
  if ((this->m_inlineCaches).ptr != (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x2d8,"(this->m_inlineCaches == nullptr)",
                                "this->m_inlineCaches == nullptr");
    if (!bVar4) goto LAB_00d59b75;
    *puVar7 = 0;
  }
  uVar1 = this->inlineCacheCount;
  TVar2 = this->isInstInlineCacheCount;
  this_01 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
  uVar18 = uVar1 + TVar2;
  if (uVar18 != 0) {
    this_02 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
    pSVar8 = FunctionProxy::GetScriptContext((FunctionProxy *)this_02);
    size = (ulong)uVar18;
    local_b0 = (undefined1  [8])&void*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_8da368f;
    data.filename._0_4_ = 0x2e2;
    data.plusSize = size;
    pRVar9 = Memory::Recycler::TrackAllocInfo(pSVar8->recycler,(TrackAllocData *)local_b0);
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00d59b75;
      *puVar7 = 0;
    }
    ppvVar10 = (void **)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                                  (pRVar9,size * 8);
    if (ppvVar10 == (void **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_00d59b75;
      *puVar7 = 0;
    }
    local_b0 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_8da368f;
    data.filename._0_4_ = 0x2e5;
    data.plusSize = size;
    pRVar9 = Memory::Recycler::TrackAllocInfo(pSVar8->recycler,(TrackAllocData *)local_b0);
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00d59b75;
      *puVar7 = 0;
    }
    puVar11 = (uchar *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                                 (pRVar9,size);
    if (puVar11 == (uchar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_00d59b75;
      *puVar7 = 0;
    }
    addr = &this->m_inlineCacheTypes;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->m_inlineCacheTypes).ptr = puVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    uVar16 = this->rootObjectLoadInlineCacheStart;
    if ((ulong)uVar16 == 0) {
      uVar17 = 0;
    }
    else {
      uVar17 = 0;
      do {
        pvVar12 = new<Memory::InlineCacheAllocator>(0x20,&pSVar8->inlineCacheAllocator,0x782450);
        ppvVar10[uVar17] = pvVar12;
        uVar17 = uVar17 + 1;
      } while (uVar16 != uVar17);
    }
    this_03 = FunctionBody::GetRootObject(this_01);
    this_00 = pSVar8->threadContext;
    uVar16 = this->rootObjectLoadMethodInlineCacheStart;
    uVar15 = (uint)uVar17;
    if (uVar15 < uVar16) {
      lVar19 = 0;
      do {
        PVar6 = FunctionBody::GetPropertyIdFromCacheId(this_01,uVar15 + (int)lVar19);
        pPVar13 = ThreadContext::GetPropertyName(this_00,PVar6);
        pIVar14 = RootObjectBase::GetInlineCache(this_03,pPVar13,false,false);
        ppvVar10[(uVar17 & 0xffffffff) + lVar19] = pIVar14;
        lVar19 = lVar19 + 1;
      } while (((uVar17 & 0xffffffff) - (ulong)uVar16) + lVar19 != 0);
      uVar17 = (ulong)(uVar15 + (int)lVar19);
    }
    uVar16 = this->rootObjectStoreInlineCacheStart;
    uVar15 = (uint)uVar17;
    if (uVar15 < uVar16) {
      lVar19 = 0;
      do {
        PVar6 = FunctionBody::GetPropertyIdFromCacheId(this_01,uVar15 + (int)lVar19);
        pPVar13 = ThreadContext::GetPropertyName(this_00,PVar6);
        pIVar14 = RootObjectBase::GetInlineCache(this_03,pPVar13,true,false);
        ppvVar10[(uVar17 & 0xffffffff) + lVar19] = pIVar14;
        lVar19 = lVar19 + 1;
      } while (((uVar17 & 0xffffffff) - (ulong)uVar16) + lVar19 != 0);
      uVar17 = (ulong)(uVar15 + (int)lVar19);
    }
    uVar16 = (uint)uVar17;
    if (uVar16 < uVar1) {
      data._32_8_ = (uVar17 & 0xffffffff) - (ulong)uVar1;
      lVar19 = 0;
      do {
        PVar6 = FunctionBody::GetPropertyIdFromCacheId(this_01,uVar16 + (int)lVar19);
        pPVar13 = ThreadContext::GetPropertyName(this_00,PVar6);
        pIVar14 = RootObjectBase::GetInlineCache(this_03,pPVar13,false,true);
        ppvVar10[(uVar17 & 0xffffffff) + lVar19] = pIVar14;
        lVar19 = lVar19 + 1;
      } while (data._32_8_ + lVar19 != 0);
      uVar16 = uVar16 + (int)lVar19;
    }
    if (uVar16 < uVar18) {
      lVar19 = 0;
      do {
        pSVar8 = FunctionProxy::GetScriptContext((FunctionProxy *)this_01);
        pvVar12 = new<Memory::CacheAllocator>(0x20,&pSVar8->isInstInlineCacheAllocator,0x78235a);
        ppvVar10[(ulong)uVar16 + lVar19] = pvVar12;
        lVar19 = lVar19 + 1;
      } while ((uVar1 + TVar2) - uVar16 != (int)lVar19);
    }
    pSVar8 = FunctionProxy::GetScriptContext((FunctionProxy *)this_01);
    local_b0 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_8da368f;
    data.filename._0_4_ = 0x30e;
    data.plusSize = size;
    pRVar9 = Memory::Recycler::TrackAllocInfo(pSVar8->recycler,(TrackAllocData *)local_b0);
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00d59b75;
      *puVar7 = 0;
    }
    puVar11 = (uchar *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                                 (pRVar9,size);
    if (puVar11 == (uchar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) {
LAB_00d59b75:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    addr_00 = &this->m_inlineCaches;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = puVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    Memory::Recycler::WBSetBit((char *)addr_00);
    addr_00->ptr = ppvVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  }
  return;
}

Assistant:

void ScriptFunctionWithInlineCache::AllocateInlineCache()
    {
        Assert(this->m_inlineCaches == nullptr);
        uint isInstInlineCacheStart = this->GetInlineCacheCount();
        uint totalCacheCount = isInstInlineCacheStart + isInstInlineCacheCount;
        Js::FunctionBody* functionBody = this->GetFunctionBody();

        if (totalCacheCount != 0)
        {
            // Root object inline cache are not leaf
            Js::ScriptContext* scriptContext = this->GetFunctionBody()->GetScriptContext();
            void ** inlineCaches = RecyclerNewArrayZ(scriptContext->GetRecycler() ,
                void*, totalCacheCount);
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(),
                byte, totalCacheCount);
#endif
            uint i = 0;
            uint plainInlineCacheEnd = rootObjectLoadInlineCacheStart;
            __analysis_assume(plainInlineCacheEnd <= totalCacheCount);
            for (; i < plainInlineCacheEnd; i++)
            {
                inlineCaches[i] = AllocatorNewZ(InlineCacheAllocator,
                    scriptContext->GetInlineCacheAllocator(), InlineCache);
            }
            Js::RootObjectBase * rootObject = functionBody->GetRootObject();
            ThreadContext * threadContext = scriptContext->GetThreadContext();
            uint rootObjectLoadInlineCacheEnd = rootObjectLoadMethodInlineCacheStart;
            __analysis_assume(rootObjectLoadInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(i)), false, false);
            }
            uint rootObjectLoadMethodInlineCacheEnd = rootObjectStoreInlineCacheStart;
            __analysis_assume(rootObjectLoadMethodInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(i)), true, false);
            }
            uint rootObjectStoreInlineCacheEnd = isInstInlineCacheStart;
            __analysis_assume(rootObjectStoreInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
#pragma prefast(suppress:6386, "The analysis assume didn't help prefast figure out this is in range")
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(i)), false, true);
            }
            for (; i < totalCacheCount; i++)
            {
                inlineCaches[i] = AllocatorNewStructZ(CacheAllocator,
                    functionBody->GetScriptContext()->GetIsInstInlineCacheAllocator(), IsInstInlineCache);
            }
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(functionBody->GetScriptContext()->GetRecycler(),
                byte, totalCacheCount);
#endif
            this->m_inlineCaches = inlineCaches;
        }
    }